

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

uint32_t WrapPosition(uint64_t position)

{
  uint64_t gb;
  uint32_t result;
  uint64_t position_local;
  
  gb._4_4_ = (uint)position;
  if (2 < position >> 0x1e) {
    gb._4_4_ = gb._4_4_ & 0x3fffffff | (((int)(position >> 0x1e) - 1U & 1) + 1) * 0x40000000;
  }
  return gb._4_4_;
}

Assistant:

static uint32_t WrapPosition(uint64_t position) {
  uint32_t result = (uint32_t)position;
  uint64_t gb = position >> 30;
  if (gb > 2) {
    /* Wrap every 2GiB; The first 3GB are continuous. */
    result = (result & ((1u << 30) - 1)) | ((uint32_t)((gb - 1) & 1) + 1) << 30;
  }
  return result;
}